

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.cpp
# Opt level: O3

vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
* handlegraph::algorithms::strongly_connected_components(HandleGraph *handle_graph)

{
  HandleGraph *in_RSI;
  vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  *in_RDI;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> stack;
  int64_t index;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  already_used;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  on_stack;
  unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
  discover_idx;
  unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
  roots;
  void *local_1d8;
  undefined8 uStack_1d0;
  long local_1c8;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_188;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_148;
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_110;
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_198 = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_1c8 = 0;
  local_1d8 = (void *)0x0;
  uStack_1d0 = 0;
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  (in_RDI->
  super__Vector_base<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110._M_buckets = &local_110._M_single_bucket;
  local_110._M_bucket_count = 1;
  local_110._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_110._M_element_count = 0;
  local_110._M_rehash_policy._M_max_load_factor = 1.0;
  local_110._M_rehash_policy._M_next_resize = 0;
  local_110._M_single_bucket = (__node_base_ptr)0x0;
  local_1b8._8_8_ = 0;
  local_1b8._M_unused._M_object = operator_new(0x28);
  *(_Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    **)local_1b8._M_unused._0_8_ = &local_68;
  *(_Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    **)((long)local_1b8._M_unused._0_8_ + 8) = &local_a0;
  *(undefined8 **)((long)local_1b8._M_unused._0_8_ + 0x10) = &local_198;
  *(void ***)((long)local_1b8._M_unused._0_8_ + 0x18) = &local_1d8;
  *(_Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    **)((long)local_1b8._M_unused._0_8_ + 0x20) = &local_d8;
  local_1a0 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:61:9)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:61:9)>
              ::_M_manager;
  local_168._8_8_ = 0;
  local_168._M_unused._M_object = operator_new(0x38);
  *(undefined1 **)local_168._M_unused._0_8_ = local_190;
  *(_Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    **)((long)local_168._M_unused._0_8_ + 8) = &local_d8;
  *(_Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    **)((long)local_168._M_unused._0_8_ + 0x10) = &local_68;
  *(_Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    **)((long)local_168._M_unused._0_8_ + 0x18) = &local_a0;
  *(void ***)((long)local_168._M_unused._0_8_ + 0x20) = &local_1d8;
  *(_Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    **)((long)local_168._M_unused._0_8_ + 0x28) = &local_110;
  *(vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
    **)((long)local_168._M_unused._0_8_ + 0x30) = in_RDI;
  local_150 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:74:9)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:74:9)>
              ::_M_manager;
  local_188.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_buckets = &local_148._M_single_bucket;
  local_148._M_bucket_count = 1;
  local_148._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148._M_element_count = 0;
  local_148._M_rehash_policy._M_max_load_factor = 1.0;
  local_148._M_rehash_policy._4_4_ = 0;
  local_148._M_rehash_policy._M_next_resize = 0;
  local_148._M_single_bucket = (__node_base_ptr)0x0;
  internal::dfs(in_RSI,(function<void_(const_handlegraph::handle_t_&)> *)&local_1b8,
                (function<void_(const_handlegraph::handle_t_&)> *)&local_168,&local_188,
                (unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                 *)&local_148);
  std::
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_148);
  if (local_188.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_110);
  std::
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d8);
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8,local_1c8 - (long)local_1d8);
  }
  std::
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return in_RDI;
}

Assistant:

vector<unordered_set<nid_t>> strongly_connected_components(const HandleGraph* handle_graph) {
    
#ifdef debug
    cerr << "Computing strongly connected components" << endl;
#endif
    
    // What node visit step are we on?
    int64_t index = 0;
    // What's the search root from which a node was reached?
    unordered_map<handle_t, handle_t> roots;
    // At what index step was each node discovered?
    unordered_map<handle_t, int64_t> discover_idx;
    // We need our own copy of the DFS stack
    vector<handle_t> stack;
    // And our own set of nodes already on the stack
    unordered_set<handle_t> on_stack;
    // What components did we find? Because of the way strongly connected
    // components generalizes, both orientations of a node always end up in the
    // same component.
    vector<unordered_set<nid_t>> components;
    
    // A single node ID from each component we've already added, which we use
    // to deduplicate the results
    // TODO: why do we produce duplicate components in the first place?
    unordered_set<nid_t> already_used;
    
    handlegraph::algorithms::internal::dfs(*handle_graph,
        [&](const handle_t& trav) {
        // When a NodeTraversal is first visited
#ifdef debug
        cerr << "First visit to " << handle_graph->get_id(trav) << " orientation " << handle_graph->get_is_reverse(trav) << endl;
#endif
        // It is its own root
        roots[trav] = trav;
        // We discovered it at this step
        discover_idx[trav] = index++;
        // And it's on the stack
        stack.push_back(trav);
        on_stack.insert(trav);
    },
        [&](const handle_t& trav) {
        // When a NodeTraversal is done being recursed into
#ifdef debug
        cerr << "Finishing " << handle_graph->get_id(trav) << " orientation " << handle_graph->get_is_reverse(trav) << endl;
#endif
        // Go through all the NodeTraversals reachable reading onwards from this traversal.
        handle_graph->follow_edges(trav, false, [&](const handle_t& next) {
#ifdef debug
            cerr << "\tCould next reach " << handle_graph->get_id(next) << " orientation " << handle_graph->get_is_reverse(next) << endl;
#endif
            if (on_stack.count(next)) {
                // If any of those NodeTraversals are on the stack already
#ifdef debug
                cerr << "\t\tIt is already on the stack, so maybe we want its root" << endl;
#endif
                auto& node_root = roots[trav];
                auto& next_root = roots[next];
#ifdef debug
                cerr << "\t\t\tWe have root " << handle_graph->get_id(node_root) << " orientation "
                << handle_graph->get_is_reverse(node_root)
                << " discovered at time " << discover_idx[node_root] << endl;
                cerr << "\t\t\tThey have root " << handle_graph->get_id(next_root) << " orientation "
                << handle_graph->get_is_reverse(next_root)
                << " discovered at time " << discover_idx[next_root] << endl;
#endif
                // Adopt the root of the NodeTraversal that was discovered first.
                roots[trav] = discover_idx[node_root] < discover_idx[next_root] ?
                node_root : next_root;
#ifdef debug
                cerr << "\t\t\tWinning root: " << handle_graph->get_id(roots[trav]) << " orientation "
                << handle_graph->get_is_reverse(roots[trav]) << endl;
#endif
            }
            return true;
        });
        
        if (roots[trav] == trav) {
            // If we didn't find a better root
#ifdef debug
            cerr << "\tWe are our own best root, so glom up everything under us" << endl;
#endif
            handle_t other;
            bool is_duplicate = false;
            unordered_set<nid_t> component;
            do
            {
                // Grab everything that was put on the DFS stack below us
                // and put it in our component.
                other = stack.back();
                stack.pop_back();
                on_stack.erase(other);
                
                nid_t node_id = handle_graph->get_id(other);
                
                if (already_used.count(node_id)) {
                    is_duplicate = true;
                    break;
                }
                
                component.insert(node_id);
#ifdef debug
                cerr << "\t\tSnarf up node " << handle_graph->get_id(other) << " from handle in orientation "
                << handle_graph->get_is_reverse(other) << endl;
#endif
            } while (other != trav);
            
            if (!is_duplicate) {
                // use one node ID to mark this component as finished
                already_used.insert(*component.begin());
                // add it to the return valuse
                components.emplace_back(std::move(component));
            }
        }
    },
        vector<handle_t>(), unordered_set<handle_t>());
    
    return components;
}